

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall Liby::EventLoop::run(EventLoop *this,BoolFunctor *bf)

{
  bool bVar1;
  pointer this_00;
  pointer this_01;
  pointer pPVar2;
  BoolFunctor *bf_local;
  EventLoop *this_local;
  
  this_00 = std::unique_ptr<Liby::EventQueue,_std::default_delete<Liby::EventQueue>_>::operator->
                      (&this->equeue_);
  EventQueue::start(this_00);
  this_01 = std::unique_ptr<Liby::TimerQueue,_std::default_delete<Liby::TimerQueue>_>::operator->
                      (&this->tqueue_);
  TimerQueue::start(this_01);
  while( true ) {
    bVar1 = std::function<bool_()>::operator()(bf);
    if (!bVar1) break;
    pPVar2 = std::unique_ptr<Liby::Poller,_std::default_delete<Liby::Poller>_>::operator->
                       (&this->poller_);
    (*pPVar2->_vptr_Poller[5])(pPVar2,0);
  }
  return;
}

Assistant:

void EventLoop::run(BoolFunctor bf) {
    equeue_->start();
    tqueue_->start();

    while (bf()) {
#ifdef __APPLE__
        tqueue_->handleTimeoutEvents();

        Timestamp min;
        const Timestamp *pmin = tqueue_->getMinTimestamp();
        Timestamp *p = nullptr;
        if (pmin != nullptr) {
            min = *pmin;
            p = &min;
        }

        poller_->loop_once(p);

        tqueue_->handleTimeoutEvents();
#elif defined(__linux__)

        poller_->loop_once();

#endif
    }
}